

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O1

void Fxu_ListCubeDelLiteral(Fxu_Cube *pCube,Fxu_Lit *pLink)

{
  int *piVar1;
  Fxu_Lit *pFVar2;
  
  if ((pCube->lLits).pHead == pLink) {
    (pCube->lLits).pHead = pLink->pHNext;
  }
  if ((pCube->lLits).pTail == pLink) {
    (pCube->lLits).pTail = pLink->pHPrev;
  }
  pFVar2 = pLink->pHPrev;
  if (pFVar2 != (Fxu_Lit *)0x0) {
    pFVar2->pHNext = pLink->pHNext;
  }
  if (pLink->pHNext != (Fxu_Lit *)0x0) {
    pLink->pHNext->pHPrev = pFVar2;
  }
  piVar1 = &(pCube->lLits).nItems;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void Fxu_ListCubeDelLiteral( Fxu_Cube * pCube, Fxu_Lit * pLink )
{
	Fxu_ListLit * pList = &(pCube->lLits);
	if ( pList->pHead == pLink )
		 pList->pHead = pLink->pHNext;
	if ( pList->pTail == pLink )
		 pList->pTail = pLink->pHPrev;
	if ( pLink->pHPrev )
		 pLink->pHPrev->pHNext = pLink->pHNext;
	if ( pLink->pHNext )
		 pLink->pHNext->pHPrev = pLink->pHPrev;
	pList->nItems--;
}